

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O0

WJTL_STATUS
VerifyJsonParsesAsListOfDictionariesOfNumbers
          (_Bool IsJson5,char *Json,uint32_t ListCount,uint32_t DictionaryCount)

{
  JL_STATUS JVar1;
  JL_DATA_TYPE JVar2;
  uint32_t uVar3;
  bool bVar4;
  char local_98;
  _Bool _result_14;
  _Bool _result_13;
  _Bool _result_12;
  _Bool _result_11;
  _Bool _result_10;
  _Bool _result_9;
  _Bool _result_8;
  char keyName [32];
  uint64_t local_70;
  uint64_t u64;
  JlDataObject *object;
  uint32_t x;
  _Bool _result_7;
  _Bool _result_6;
  _Bool _result_5;
  uint32_t i;
  uint uStack_4c;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  _Bool _result;
  uint32_t counter;
  JlDataObject *dictionaryObject;
  JlListItem *enumerator;
  size_t sStack_30;
  WJTL_STATUS TestReturn;
  size_t errorAtPos;
  JlDataObject *listObject;
  uint32_t DictionaryCount_local;
  uint32_t ListCount_local;
  char *Json_local;
  _Bool IsJson5_local;
  
  errorAtPos = 0;
  sStack_30 = 100;
  enumerator._4_4_ = WJTL_STATUS_SUCCESS;
  dictionaryObject = (JlDataObject *)0x0;
  __result_3 = (JlDataObject *)0x0;
  uStack_4c = 0;
  listObject._0_4_ = DictionaryCount;
  listObject._4_4_ = ListCount;
  _DictionaryCount_local = Json;
  Json_local._7_1_ = IsJson5;
  JVar1 = JlParseJsonEx(Json,IsJson5,(JlDataObject **)&errorAtPos,&stack0xffffffffffffffd0);
  i._3_1_ = JVar1 == JL_STATUS_SUCCESS;
  WjTestLib_Assert((_Bool)i._3_1_,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x2f9);
  if ((i._3_1_ & 1) == 0) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  i._2_1_ = errorAtPos != 0;
  WjTestLib_Assert((_Bool)i._2_1_,"(listObject) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x2fa);
  if ((i._2_1_ & 1) == 0) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar2 = JlGetObjectType((JlDataObject *)errorAtPos);
  i._1_1_ = JVar2 == JL_DATA_TYPE_LIST;
  WjTestLib_Assert((_Bool)i._1_1_,"JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x2fb);
  if ((i._1_1_ & 1) == 0) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  i._0_1_ = sStack_30 == 0;
  WjTestLib_Assert((_Bool)(byte)i,"errorAtPos == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x2fc);
  if (((byte)i & 1) == 0) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  uVar3 = JlGetListCount((JlDataObject *)errorAtPos);
  _result_5 = uVar3 == listObject._4_4_;
  WjTestLib_Assert(_result_5,"JlGetListCount( listObject ) == ListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x2fe);
  if ((_result_5 & 1U) == 0) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  dictionaryObject = (JlDataObject *)0x0;
  for (x = 0; x < listObject._4_4_; x = x + 1) {
    __result_3 = (JlDataObject *)0x0;
    JVar1 = JlGetObjectListNextItem
                      ((JlDataObject *)errorAtPos,(JlDataObject **)&_result_3,
                       (JlListItem **)&dictionaryObject);
    object._7_1_ = JVar1 == JL_STATUS_SUCCESS;
    WjTestLib_Assert((_Bool)object._7_1_,
                     "((JL_STATUS)(JlGetObjectListNextItem( listObject, &dictionaryObject, &enumerator ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x304);
    if ((object._7_1_ & 1) == 0) {
      enumerator._4_4_ = WJTL_STATUS_FAILED;
    }
    object._6_1_ = __result_3 != (JlDataObject *)0x0;
    WjTestLib_Assert((_Bool)object._6_1_,"(dictionaryObject) != NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x305);
    if ((object._6_1_ & 1) == 0) {
      enumerator._4_4_ = WJTL_STATUS_FAILED;
    }
    JVar2 = JlGetObjectType(__result_3);
    object._5_1_ = JVar2 == JL_DATA_TYPE_DICTIONARY;
    WjTestLib_Assert((_Bool)object._5_1_,
                     "JlGetObjectType( dictionaryObject ) == JL_DATA_TYPE_DICTIONARY",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x306);
    if ((object._5_1_ & 1) == 0) {
      enumerator._4_4_ = WJTL_STATUS_FAILED;
    }
    for (object._0_4_ = 0; (uint)object < (uint32_t)listObject; object._0_4_ = (uint)object + 1) {
      u64 = 0;
      local_70 = 0;
      uStack_4c = uStack_4c + 1;
      memset(&local_98,0,0x20);
      sprintf(&local_98,"num%u",(ulong)uStack_4c);
      JVar1 = JlGetObjectFromDictionaryByKey(__result_3,&local_98,(JlDataObject **)&u64);
      WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlGetObjectFromDictionaryByKey( dictionaryObject, keyName, &object ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x311);
      if (JVar1 != JL_STATUS_SUCCESS) {
        enumerator._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar4 = u64 != 0;
      WjTestLib_Assert(bVar4,"(object) != NULL",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x312);
      if (!bVar4) {
        enumerator._4_4_ = WJTL_STATUS_FAILED;
      }
      JVar2 = JlGetObjectType((JlDataObject *)u64);
      WjTestLib_Assert(JVar2 == JL_DATA_TYPE_NUMBER,
                       "JlGetObjectType( object ) == JL_DATA_TYPE_NUMBER",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x313);
      if (JVar2 != JL_DATA_TYPE_NUMBER) {
        enumerator._4_4_ = WJTL_STATUS_FAILED;
      }
      JVar1 = JlGetObjectNumberU64((JlDataObject *)u64,&local_70);
      WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlGetObjectNumberU64( object, &u64 ))) == (JL_STATUS_SUCCESS)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x314);
      if (JVar1 != JL_STATUS_SUCCESS) {
        enumerator._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar4 = local_70 == uStack_4c;
      WjTestLib_Assert(bVar4,"u64 == (uint64_t)counter",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x315);
      if (!bVar4) {
        enumerator._4_4_ = WJTL_STATUS_FAILED;
      }
    }
  }
  JVar1 = JlGetObjectListNextItem
                    ((JlDataObject *)errorAtPos,(JlDataObject **)&_result_3,
                     (JlListItem **)&dictionaryObject);
  WjTestLib_Assert(JVar1 == JL_STATUS_END_OF_DATA,
                   "(JlGetObjectListNextItem( listObject, &dictionaryObject, &enumerator )) == (JL_STATUS_END_OF_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x31a);
  if (JVar1 != JL_STATUS_END_OF_DATA) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlFreeObjectTree((JlDataObject **)&errorAtPos);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &listObject ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfDictionariesOfNumbers",0x31d);
  if (JVar1 != JL_STATUS_SUCCESS) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  return enumerator._4_4_;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsListOfDictionariesOfNumbers
    (
        bool            IsJson5,
        char const*     Json,
        uint32_t        ListCount,
        uint32_t        DictionaryCount
    )
{
    JlDataObject*   listObject = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;
    JlListItem*     enumerator = NULL;
    JlDataObject*   dictionaryObject = NULL;
    uint32_t        counter = 0;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ) );
    JL_ASSERT_NOT_NULL( listObject );
    JL_ASSERT( JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST );
    JL_ASSERT( errorAtPos == 0 );

    JL_ASSERT( JlGetListCount( listObject ) == ListCount );

    enumerator = NULL;
    for( uint32_t i=0; i<ListCount; i++ )
    {
        dictionaryObject = NULL;
        JL_ASSERT_SUCCESS( JlGetObjectListNextItem( listObject, &dictionaryObject, &enumerator ) );
        JL_ASSERT_NOT_NULL( dictionaryObject );
        JL_ASSERT( JlGetObjectType( dictionaryObject ) == JL_DATA_TYPE_DICTIONARY );

        for( uint32_t x=0; x<DictionaryCount; x++ )
        {
            JlDataObject* object = NULL;
            uint64_t u64 = 0;

            counter += 1;
            char keyName [32] = {0};
            sprintf( keyName, "num%u", counter );

            JL_ASSERT_SUCCESS( JlGetObjectFromDictionaryByKey( dictionaryObject, keyName, &object ) );
            JL_ASSERT_NOT_NULL( object );
            JL_ASSERT( JlGetObjectType( object ) == JL_DATA_TYPE_NUMBER );
            JL_ASSERT_SUCCESS( JlGetObjectNumberU64( object, &u64 ) );
            JL_ASSERT( u64 == (uint64_t)counter );
        }
    }

    // Verify there are no more items in the list
    JL_ASSERT_STATUS( JlGetObjectListNextItem( listObject, &dictionaryObject, &enumerator ), JL_STATUS_END_OF_DATA );

    // Clean up
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &listObject ) );

    return TestReturn;
}